

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyURIDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AnyURIDatatypeValidator::encode
          (AnyURIDatatypeValidator *this,XMLCh *content,XMLSize_t len,XMLBuffer *encoded,
          MemoryManager *manager)

{
  byte bVar1;
  XMLCh toAppend;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  long lVar5;
  char tempStr_1 [3];
  char tempStr [3];
  XMLSize_t charsEaten;
  XMLByte *toFill;
  
  lVar5 = 0;
  XVar4 = len;
  while( true ) {
    if (XVar4 == 0) {
      return;
    }
    toAppend = *content;
    if (0x7f < (ushort)toAppend) break;
    if (encode::needEscapeMap[(uint)(ushort)toAppend] == true) {
      tempStr[2] = '\0';
      tempStr[0] = '\0';
      tempStr[1] = '\0';
      sprintf(tempStr,"%02X");
      XMLBuffer::append(encoded,L'%');
      XMLBuffer::append(encoded,(short)tempStr[0]);
      toAppend = (XMLCh)tempStr[1];
    }
    XMLBuffer::append(encoded,toAppend);
    content = content + 1;
    lVar5 = lVar5 + 4;
    XVar4 = XVar4 - 1;
  }
  XVar3 = len * 4 - lVar5;
  iVar2 = (*manager->_vptr_MemoryManager[3])();
  toFill = (XMLByte *)CONCAT44(extraout_var,iVar2);
  XMLUTF8Transcoder::XMLUTF8Transcoder
            ((XMLUTF8Transcoder *)tempStr,(XMLCh *)XMLUni::fgUTF8EncodingString,XVar3 + 1,manager);
  XVar3 = XMLUTF8Transcoder::transcodeTo
                    ((XMLUTF8Transcoder *)tempStr,content,XVar4,toFill,XVar3,&charsEaten,
                     UnRep_RepChar);
  if (charsEaten == XVar4) {
    for (XVar4 = 0; XVar3 != XVar4; XVar4 = XVar4 + 1) {
      bVar1 = toFill[XVar4];
      if (((char)bVar1 < '\0') || (encode::needEscapeMap[bVar1] == true)) {
        tempStr_1[2] = '\0';
        tempStr_1[0] = '\0';
        tempStr_1[1] = '\0';
        sprintf(tempStr_1,"%02X");
        XMLBuffer::append(encoded,L'%');
        XMLBuffer::append(encoded,(short)tempStr_1[0]);
        XMLBuffer::append(encoded,(short)tempStr_1[1]);
      }
      else {
        XMLBuffer::append(encoded,(short)(char)bVar1);
      }
    }
    (*manager->_vptr_MemoryManager[4])(manager,toFill);
    XMLUTF8Transcoder::~XMLUTF8Transcoder((XMLUTF8Transcoder *)tempStr);
    return;
  }
  __assert_fail("charsEaten == remContentLen",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AnyURIDatatypeValidator.cpp"
                ,0xa2,
                "void xercesc_4_0::AnyURIDatatypeValidator::encode(const XMLCh *const, const XMLSize_t, XMLBuffer &, MemoryManager *const)"
               );
}

Assistant:

void AnyURIDatatypeValidator::encode(const XMLCh* const content, const XMLSize_t len, XMLBuffer& encoded, MemoryManager* const manager)
{
    static const bool needEscapeMap[] = {
        true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , /* 0x00 to 0x0F need escape */
        true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , /* 0x10 to 0x1F need escape */
        true , false, true , false, false, false, false, false, false, false, false, false, false, false, false, false, /* 0x20:' ', 0x22:'"' */
        false, false, false, false, false, false, false, false, false, false, false, false, true , false, true , false, /* 0x3C:'<', 0x3E:'>' */
        false, false, false, false, false, false, false, false, false, false, false, false, false, false, false, false,
        false, false, false, false, false, false, false, false, false, false, false, false, true , false, true , false, /* 0x5C:'\\', 0x5E:'^' */
        true , false, false, false, false, false, false, false, false, false, false, false, false, false, false, false, /* 0x60:'`' */
        false, false, false, false, false, false, false, false, false, false, false, true , true , true , true , true   /* 0x7B:'{', 0x7C:'|', 0x7D:'}', 0x7E:'~', 0x7F:DEL */
    };

    // For each character in content
    XMLSize_t i;
    for (i = 0; i < len; i++)
    {
        int ch = (int)content[i];
        // If it's not an ASCII character, break here, and use UTF-8 encoding
        if (ch >= 128)
            break;

        if (needEscapeMap[ch])
        {
            char tempStr[3] = "\0";
            sprintf(tempStr, "%02X", ch);
            encoded.append('%');
            encoded.append((XMLCh)tempStr[0]);
            encoded.append((XMLCh)tempStr[1]);
        }
        else
        {
            encoded.append((XMLCh)ch);
        }
    }

    // we saw some non-ascii character
    if (i < len) {
        // get UTF-8 bytes for the remaining sub-string
        const XMLCh* remContent = (XMLCh*)&content[i];
        const XMLSize_t remContentLen = len - i;
        XMLByte* UTF8Byte = (XMLByte*)manager->allocate((remContentLen*4+1) * sizeof(XMLByte));
        XMLSize_t charsEaten;

        XMLUTF8Transcoder transcoder(XMLUni::fgUTF8EncodingString, remContentLen*4+1, manager);
        XMLSize_t utf8Len = transcoder.transcodeTo(remContent, remContentLen, UTF8Byte, remContentLen*4, charsEaten, XMLTranscoder::UnRep_RepChar);
        assert(charsEaten == remContentLen);

        XMLSize_t j;
        for (j = 0; j < utf8Len; j++) {
            XMLByte b = UTF8Byte[j];
            if (b >= 128 || needEscapeMap[b])
            {
                char tempStr[3] = "\0";
                sprintf(tempStr, "%02X", b);
                encoded.append('%');
                encoded.append((XMLCh)tempStr[0]);
                encoded.append((XMLCh)tempStr[1]);
            }
            else
            {
                encoded.append((XMLCh)b);
            }
        }
        manager->deallocate(UTF8Byte);
    }
}